

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O1

int sock_pton_with_prefix(char *cp,sockaddr *sa,int *int_prefix)

{
  char cVar1;
  addrinfo *paVar2;
  sockaddr *psVar3;
  int iVar4;
  ushort **ppuVar5;
  void *pvVar6;
  char *__name;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  char *pcVar15;
  char *__s;
  addrinfo *servinfo;
  addrinfo *local_78;
  sockaddr *local_70;
  addrinfo local_68;
  
  iVar4 = -1;
  if (int_prefix != (int *)0x0 && (sa != (sockaddr *)0x0 && cp != (char *)0x0)) {
    ppuVar5 = __ctype_b_loc();
    lVar8 = -(long)cp;
    uVar13 = 0;
    do {
      uVar12 = uVar13;
      uVar13 = uVar12 + 1;
    } while ((*(byte *)((long)*ppuVar5 + (long)cp[uVar12] * 2 + 1) & 0x20) != 0);
    iVar4 = -2;
    if (cp[uVar12] == '[') {
      pcVar10 = cp + uVar12;
      __s = cp + uVar13;
      sVar14 = 0xffffffffffffffff;
      pcVar9 = (char *)0x0;
      pcVar15 = pcVar10;
      do {
        cVar1 = *pcVar15;
        if (cVar1 == '/') {
          pcVar9 = pcVar15 + 1;
        }
        else {
          if (cVar1 == '\0') {
            return -2;
          }
          if (cVar1 == ']') {
            local_70 = sa;
            if (pcVar9 == (char *)0x0) {
              pvVar6 = memchr(__s,0,sVar14);
              sVar11 = (long)pvVar6 + (lVar8 - uVar13);
              if (pvVar6 == (void *)0x0) {
                sVar11 = sVar14;
              }
              __name = (char *)malloc(sVar11 + 1);
              if (__name != (char *)0x0) {
                memcpy(__name,__s,sVar11 + 1);
                __name[sVar11] = '\0';
              }
              *int_prefix = 0x80;
            }
            else {
              pvVar6 = memchr(__s,0,(size_t)(pcVar9 + lVar8 + ~uVar13));
              pcVar7 = (char *)((long)pvVar6 + (lVar8 - uVar13));
              if (pvVar6 == (void *)0x0) {
                pcVar7 = pcVar9 + lVar8 + ~uVar13;
              }
              __name = (char *)malloc((size_t)(pcVar7 + 1));
              if (__name != (char *)0x0) {
                memcpy(__name,__s,(size_t)(pcVar7 + 1));
                __name[(long)pcVar7] = '\0';
              }
              pvVar6 = memchr(pcVar9,0,(long)pcVar10 - (long)pcVar9);
              sVar14 = (long)pvVar6 - (long)pcVar9;
              if (pvVar6 == (void *)0x0) {
                sVar14 = (long)pcVar10 - (long)pcVar9;
              }
              pcVar10 = (char *)malloc(sVar14 + 1);
              if (pcVar10 != (char *)0x0) {
                memcpy(pcVar10,pcVar9,sVar14 + 1);
                pcVar10[sVar14] = '\0';
                iVar4 = atoi(pcVar10);
                *int_prefix = iVar4;
                free(pcVar10);
              }
            }
            pcVar9 = (char *)0x0;
            do {
              pcVar10 = pcVar15 + (lVar8 - uVar13);
              pcVar7 = pcVar15;
LAB_00106fc3:
              while( true ) {
                pcVar15 = pcVar7 + 1;
                pcVar10 = pcVar10 + 1;
                cVar1 = *pcVar15;
                if (cVar1 == ':') break;
                pcVar7 = pcVar15;
                if (cVar1 == '\0') goto LAB_00106fff;
              }
              if (pcVar9 != (char *)0x0) goto code_r0x00106fd9;
              pcVar9 = pcVar7 + 2;
            } while( true );
          }
        }
        pcVar15 = pcVar15 + 1;
        sVar14 = sVar14 + 1;
        pcVar10 = pcVar10 + 1;
      } while( true );
    }
  }
  return iVar4;
code_r0x00106fd9:
  pcVar7 = pcVar15;
  if (__name == (char *)0x0) {
    __name = strdup(__s);
    pcVar9 = (char *)0x0;
LAB_00106fff:
    if (__name == (char *)0x0) {
      if (pcVar9 == (char *)0x0 || cVar1 != '\0') {
        pvVar6 = memchr(__s,0,(size_t)pcVar10);
        pcVar15 = (char *)((long)pvVar6 + (lVar8 - uVar13));
        if (pvVar6 == (void *)0x0) {
          pcVar15 = pcVar10;
        }
        __name = (char *)malloc((size_t)(pcVar15 + 1));
        if (__name != (char *)0x0) {
          memcpy(__name,__s,(size_t)(pcVar15 + 1));
          __name[(long)pcVar15] = '\0';
        }
      }
      else if ((long)(pcVar9 + (lVar8 - uVar13)) < 2) {
        __name = (char *)0x0;
      }
      else {
        __name = pcp_strndup(__s,(size_t)(pcVar9 + ~uVar13 + lVar8));
      }
    }
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_socktype = 2;
    local_68.ai_protocol = 0;
    local_68.ai_flags = 8;
    local_68.ai_family = 0;
    iVar4 = getaddrinfo(__name,pcVar9,&local_68,&local_78);
    psVar3 = local_70;
    paVar2 = local_78;
    if (iVar4 != 0) {
      sock_pton_with_prefix_cold_1();
      return -2;
    }
    goto joined_r0x00107050;
  }
  goto LAB_00106fc3;
joined_r0x00107050:
  if (paVar2 == (addrinfo *)0x0) {
LAB_001070a3:
    freeaddrinfo(local_78);
    if (__name != (char *)0x0) {
      free(__name);
    }
    if (psVar3->sa_family == 10) {
      if (0x80 < *int_prefix) {
        return -2;
      }
    }
    else if ((psVar3->sa_family == 2) && (0x20 < *int_prefix)) {
      return -2;
    }
    return 0;
  }
  if ((paVar2->ai_family | 8U) == 10) {
    sVar14 = 0x10;
    if (paVar2->ai_addr->sa_family == 10) {
      sVar14 = 0x1c;
    }
    memcpy(local_70,paVar2->ai_addr,sVar14);
    if (__name == (char *)0x0) {
      if (paVar2->ai_family != 10) {
        return -2;
      }
      psVar3[1].sa_data[2] = '\0';
      psVar3[1].sa_data[3] = '\0';
      psVar3[1].sa_data[4] = '\0';
      psVar3[1].sa_data[5] = '\0';
      psVar3[1].sa_data[6] = '\0';
      psVar3[1].sa_data[7] = '\0';
      psVar3[1].sa_data[8] = '\0';
      psVar3[1].sa_data[9] = '\0';
      *(undefined8 *)(psVar3[1].sa_data + 10) = 0;
      psVar3->sa_data[6] = '\0';
      psVar3->sa_data[7] = '\0';
      psVar3->sa_data[8] = '\0';
      psVar3->sa_data[9] = '\0';
      psVar3->sa_data[10] = '\0';
      psVar3->sa_data[0xb] = '\0';
      psVar3->sa_data[0xc] = '\0';
      psVar3->sa_data[0xd] = '\0';
      psVar3[1].sa_family = 0;
      psVar3[1].sa_data[0] = '\0';
      psVar3[1].sa_data[1] = '\0';
      psVar3[1].sa_data[2] = '\0';
      psVar3[1].sa_data[3] = '\0';
      psVar3[1].sa_data[4] = '\0';
      psVar3[1].sa_data[5] = '\0';
    }
    goto LAB_001070a3;
  }
  paVar2 = paVar2->ai_next;
  goto joined_r0x00107050;
}

Assistant:

int sock_pton_with_prefix(const char *cp, struct sockaddr *sa,
                          int *int_prefix) {
    const char *prefix_begin = NULL;
    char *prefix = NULL;

    const char *ip_end;
    char *host_name = NULL;
    const char *port = NULL;

    if ((!cp) || (!sa) || (!int_prefix)) {
        return -1;
    }

    // skip ws
    while ((cp) && (isspace(*cp))) {
        ++cp;
    }

    ip_end = cp;
    if (*cp == '[') { // find matching bracket ']'
        ++cp;
        while ((*ip_end) && (*ip_end != ']')) {
            if (*ip_end == '/') {
                prefix_begin = ip_end + 1;
            }
            ++ip_end;
        }

        if (!*ip_end) {
            return -2;
        }

        if (prefix_begin) {
            host_name = strndup(cp, prefix_begin - cp - 1);
            prefix = strndup(prefix_begin, ip_end - prefix_begin);
            if (prefix) {
                *int_prefix = atoi(prefix);
                free(prefix);
            }
        } else {
            host_name = strndup(cp, ip_end - cp);
            *int_prefix = 128;
        }
        ++ip_end;
    } else {
        return -2;
    }

    { // find start of port part
        while (*ip_end) {
            if (*ip_end == ':') {
                if (!port) {
                    port = ip_end + 1;
                } else if (host_name == NULL) { // means addr has [] block
                    port = NULL; // more than 1 ":" => assume the whole addr is
                                 // IPv6 address w/o port
                    host_name = strdup(cp);
                    break;
                }
            }
            ++ip_end;
        }
        if (!host_name) {
            if ((*ip_end == 0) && (port != NULL)) {
                if (port - cp > 1) { // only port entered
                    host_name = strndup(cp, port - cp - 1);
                }
            } else {
                host_name = strndup(cp, ip_end - cp);
            }
        }
    }

    // getaddrinfo for host
    {
        struct addrinfo hints, *servinfo, *p;
        int rv;

        memset(&hints, 0, sizeof hints);
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_DGRAM;
        hints.ai_flags = AI_V4MAPPED;

        if ((rv = getaddrinfo(host_name, port, &hints, &servinfo)) != 0) {
            fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(rv));
            if (host_name)
                free(host_name);
            return -2;
        }

        for (p = servinfo; p != NULL; p = p->ai_next) {
            if ((p->ai_family == AF_INET) || (p->ai_family == AF_INET6)) {
                memcpy(sa, p->ai_addr, SA_LEN(p->ai_addr));
                if (host_name == NULL) { // getaddrinfo returns localhost ip if
                                         // hostname is null
                    switch (p->ai_family) {
                    case AF_INET6:
                        memset(&((struct sockaddr_in6 *)sa)->sin6_addr, 0,
                               sizeof(struct sockaddr_in6));
                        break;
                    default: // Should never happen LCOV_EXCL_START
                        if (host_name)
                            free(host_name);
                        return -2;
                    } // LCOV_EXCL_STOP
                }
                break;
            }
        }
        freeaddrinfo(servinfo);
    }

    if (host_name)
        free(host_name);

    if ((sa->sa_family == AF_INET) && (*int_prefix > 32)) {

        return -2;
    }

    if ((sa->sa_family == AF_INET6) && (*int_prefix > 128)) {

        return -2;
    }

    return 0;
}